

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  Comparator *pCVar1;
  long lVar2;
  long lVar3;
  VersionSet *pVVar4;
  bool bVar5;
  pointer __first;
  pointer __last;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  FileMetaData *pFVar9;
  ulong uVar10;
  ulong uVar11;
  long *in_R9;
  Status SVar12;
  long lVar13;
  ulong uVar14;
  size_type sVar15;
  VersionSet *local_110;
  undefined4 local_104;
  undefined1 local_100 [24];
  FileMetaData *f;
  undefined8 local_e0;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  FileMetaData **local_b8;
  Saver saver;
  Slice user_key;
  Status local_50;
  FileMetaData *tmp2;
  Slice ikey;
  
  user_key.data_ = (char *)value->_M_string_length;
  ikey.size_ = (value->field_2)._M_allocated_capacity - (long)user_key.data_;
  user_key.size_ = ikey.size_ - 8;
  pCVar1 = *(Comparator **)(*(long *)options + 0x40);
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_104 = 0xffffffff;
  sVar15 = 0;
  pFVar9 = (FileMetaData *)0x0;
  local_110 = (VersionSet *)0x0;
  ikey.data_ = user_key.data_;
  do {
    lVar2 = *(long *)((long)options + sVar15 * 0x18 + 0x20);
    lVar3 = *(long *)((long)options + sVar15 * 0x18 + 0x28);
    lVar13 = lVar3 - lVar2;
    if (lVar13 == 0) {
LAB_00119450:
      bVar5 = false;
    }
    else {
      uVar14 = lVar13 >> 3;
      local_100._16_8_ = sVar15;
      if (sVar15 == 0) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
                  (&tmp,uVar14);
        if (lVar3 != lVar2) {
          uVar10 = 0;
          uVar11 = 1;
          do {
            f = *(FileMetaData **)(lVar2 + uVar10 * 8);
            saver._0_16_ = InternalKey::user_key(&f->smallest);
            iVar7 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&user_key,&saver);
            if (-1 < iVar7) {
              local_100._0_16_ = (undefined1  [16])InternalKey::user_key(&f->largest);
              iVar7 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&user_key,local_100);
              if (iVar7 < 1) {
                if (tmp.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    tmp.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
                  _M_realloc_insert<leveldb::FileMetaData*const&>
                            ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>
                              *)&tmp,(iterator)
                                     tmp.
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&f);
                }
                else {
                  *tmp.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish = f;
                  tmp.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            bVar5 = uVar11 < uVar14;
            uVar10 = uVar11;
            uVar11 = (ulong)((int)uVar11 + 1);
          } while (bVar5);
        }
        __last = tmp.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        __first = tmp.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar15 = local_100._16_8_;
        if (tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00119450;
        uVar14 = (long)tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar2 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
                  ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)
                   0x1192cd);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
                  ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )__first,
                   (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )__last,(_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>
                             )0x1192cd);
        local_b8 = tmp.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)tmp.
                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      }
      else {
        uVar6 = FindFile((InternalKeyComparator *)(*(long *)options + 0x38),
                         (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)((long)options + sVar15 * 0x18 + 0x20),&ikey);
        uVar10 = 0;
        local_b8 = (FileMetaData **)0x0;
        if (uVar6 < uVar14) {
          tmp2 = *(FileMetaData **)(lVar2 + (ulong)uVar6 * 8);
          saver._0_16_ = InternalKey::user_key(&tmp2->smallest);
          iVar7 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&user_key,&saver);
          uVar10 = (ulong)(-1 < iVar7);
          local_b8 = (FileMetaData **)0x0;
          if (-1 < iVar7) {
            local_b8 = &tmp2;
          }
        }
      }
      bVar5 = false;
      sVar15 = local_100._16_8_;
      if (uVar10 != 0) {
        uVar8 = (undefined4)local_100._16_8_;
        uVar14 = 0;
        uVar11 = 1;
        do {
          if ((pFVar9 != (FileMetaData *)0x0) && (*in_R9 == 0)) {
            *in_R9 = (long)pFVar9;
            *(undefined4 *)(in_R9 + 1) = local_104;
          }
          pFVar9 = local_b8[uVar14];
          saver._0_8_ = saver._4_8_ << 0x20;
          saver.ucmp = pCVar1;
          saver.user_key.data_ = user_key.data_;
          saver.user_key.size_ = user_key.size_;
          saver.value = (string *)stats;
          TableCache::Get((TableCache *)local_100,*(ReadOptions **)(*(long *)options + 0x30),
                          (uint64_t)k,pFVar9->number,(Slice *)pFVar9->file_size,&ikey,
                          (_func_void_void_ptr_Slice_ptr_Slice_ptr *)&saver);
          sVar15 = local_100._16_8_;
          SVar12.state_ = (char *)local_100._0_8_;
          pVVar4 = (VersionSet *)local_100._0_8_;
          local_100._0_8_ = local_110;
          if (local_110 != (VersionSet *)0x0) {
            operator_delete__(local_110);
          }
          local_104 = uVar8;
          if (((VersionSet *)SVar12.state_ != (VersionSet *)0x0) || (saver.state == kFound)) {
LAB_00119764:
            this->vset_ = (VersionSet *)SVar12.state_;
            bVar5 = true;
            local_110 = (VersionSet *)0x0;
            goto LAB_00119774;
          }
          if (saver.state == kCorrupt) {
            local_100._8_8_ = 0x12;
            local_100._0_8_ = "corrupted key for ";
            Status::Status((Status *)&f,kCorruption,(Slice *)local_100,&user_key);
            SVar12.state_ = (char *)f;
            goto LAB_00119764;
          }
          if (saver.state == kDeleted) {
            local_100._0_16_ = ZEXT816(0x12a661);
            f = (FileMetaData *)0x12a661;
            local_e0 = 0;
            Status::Status(&local_50,kNotFound,(Slice *)local_100,(Slice *)&f);
            SVar12.state_ = local_50.state_;
            goto LAB_00119764;
          }
          bVar5 = uVar11 < uVar10;
          uVar14 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
          local_110 = pVVar4;
        } while (bVar5);
        bVar5 = false;
        local_110 = (VersionSet *)SVar12.state_;
        sVar15 = local_100._16_8_;
      }
    }
LAB_00119774:
    if (bVar5) goto LAB_001197ca;
    sVar15 = sVar15 + 1;
  } while (sVar15 != 7);
  saver._0_16_ = ZEXT816(0x12a661);
  local_100._0_16_ = ZEXT816(0x12a661);
  Status::Status((Status *)this,kNotFound,(Slice *)&saver,(Slice *)local_100);
LAB_001197ca:
  if (tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tmp.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110 != (VersionSet *)0x0) {
    operator_delete__(local_110);
  }
  return (Status)(char *)this;
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  Slice ikey = k.internal_key();
  Slice user_key = k.user_key();
  const Comparator* ucmp = vset_->icmp_.user_comparator();
  Status s;

  stats->seek_file = nullptr;
  stats->seek_file_level = -1;
  FileMetaData* last_file_read = nullptr;
  int last_file_read_level = -1;

  // We can search level-by-level since entries never hop across
  // levels.  Therefore we are guaranteed that if we find data
  // in a smaller level, later levels are irrelevant.
  std::vector<FileMetaData*> tmp;
  FileMetaData* tmp2;
  for (int level = 0; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Get the list of files to search in this level
    FileMetaData* const* files = &files_[level][0];
    if (level == 0) {
      // Level-0 files may overlap each other.  Find all files that
      // overlap user_key and process them in order from newest to oldest.
      tmp.reserve(num_files);
      for (uint32_t i = 0; i < num_files; i++) {
        FileMetaData* f = files[i];
        if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
            ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
          tmp.push_back(f);
        }
      }
      if (tmp.empty()) continue;

      std::sort(tmp.begin(), tmp.end(), NewestFirst);
      files = &tmp[0];
      num_files = tmp.size();
    } else {
      // Binary search to find earliest index whose largest key >= ikey.
      uint32_t index = FindFile(vset_->icmp_, files_[level], ikey);
      if (index >= num_files) {
        files = nullptr;
        num_files = 0;
      } else {
        tmp2 = files[index];
        if (ucmp->Compare(user_key, tmp2->smallest.user_key()) < 0) {
          // All of "tmp2" is past any data for user_key
          files = nullptr;
          num_files = 0;
        } else {
          files = &tmp2;
          num_files = 1;
        }
      }
    }

    for (uint32_t i = 0; i < num_files; ++i) {
      if (last_file_read != nullptr && stats->seek_file == nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        stats->seek_file = last_file_read;
        stats->seek_file_level = last_file_read_level;
      }

      FileMetaData* f = files[i];
      last_file_read = f;
      last_file_read_level = level;

      Saver saver;
      saver.state = kNotFound;
      saver.ucmp = ucmp;
      saver.user_key = user_key;
      saver.value = value;
      s = vset_->table_cache_->Get(options, f->number, f->file_size, ikey,
                                   &saver, SaveValue);
      if (!s.ok()) {
        return s;
      }
      switch (saver.state) {
        case kNotFound:
          break;  // Keep searching in other files
        case kFound:
          return s;
        case kDeleted:
          s = Status::NotFound(Slice());  // Use empty error message for speed
          return s;
        case kCorrupt:
          s = Status::Corruption("corrupted key for ", user_key);
          return s;
      }
    }
  }

  return Status::NotFound(Slice());  // Use an empty error message for speed
}